

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O1

int get32_packet(vorb *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = get8_packet_raw(f);
  f->valid_bits = 0;
  iVar2 = get8_packet_raw(f);
  f->valid_bits = 0;
  iVar3 = get8_packet_raw(f);
  f->valid_bits = 0;
  iVar4 = get8_packet_raw(f);
  f->valid_bits = 0;
  return iVar4 * 0x1000000 + iVar3 * 0x10000 + iVar2 * 0x100 + iVar1;
}

Assistant:

static int get32_packet(vorb *f)
{
   uint32 x;
   x = get8_packet(f);
   x += get8_packet(f) << 8;
   x += get8_packet(f) << 16;
   x += (uint32) get8_packet(f) << 24;
   return x;
}